

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

int __thiscall testing::internal::UnitTestImpl::reportable_disabled_test_count(UnitTestImpl *this)

{
  pointer ppTVar1;
  TestCase *pTVar2;
  pointer ppTVar3;
  TestInfo *pTVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  pointer ppTVar8;
  int iVar9;
  uint uVar10;
  long in_FS_OFFSET;
  
  ppTVar1 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(this->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1;
  if (lVar6 == 0) {
    iVar5 = 0;
  }
  else {
    lVar6 = lVar6 >> 3;
    lVar7 = 0;
    iVar5 = 0;
    do {
      pTVar2 = ppTVar1[lVar7];
      ppTVar8 = (pTVar2->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 = *(pointer *)
                 ((long)&(pTVar2->test_info_list_).
                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                         ._M_impl + 8);
      iVar9 = 0;
      if (ppTVar8 != ppTVar3) {
        iVar9 = 0;
        do {
          pTVar4 = *ppTVar8;
          uVar10 = 0;
          if ((pTVar4->matches_filter_ == true) && ((pTVar4->is_in_another_shard_ & 1U) == 0)) {
            uVar10 = (uint)pTVar4->is_disabled_;
          }
          iVar9 = iVar9 + uVar10;
          ppTVar8 = ppTVar8 + 1;
        } while (ppTVar8 != ppTVar3);
      }
      iVar5 = iVar5 + iVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar6 + (ulong)(lVar6 == 0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int UnitTestImpl::reportable_disabled_test_count() const {
  return SumOverTestCaseList(test_cases_,
                             &TestCase::reportable_disabled_test_count);
}